

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O2

void __thiscall LEARNER::learner<char,_char>::finish(learner<char,_char> *this)

{
  if (*(long *)(this + 0xb8) != 0) {
    (**(code **)(this + 200))();
    free(*(void **)(this + 0xb8));
  }
  if (*(learner<char,_char> **)(this + 0xc0) != (learner<char,_char> *)0x0) {
    finish(*(learner<char,_char> **)(this + 0xc0));
    free(*(void **)(this + 0xc0));
    return;
  }
  return;
}

Assistant:

inline void finish()
  {
    if (finisher_fd.data)
    {
      finisher_fd.func(finisher_fd.data);
      free(finisher_fd.data);
    }
    if (finisher_fd.base)
    {
      finisher_fd.base->finish();
      free(finisher_fd.base);
    }
  }